

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rune.cc
# Opt level: O2

int duckdb_re2::chartorune(Rune *rune,char *str)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  bVar1 = *str;
  uVar3 = (uint)bVar1;
  iVar2 = 1;
  if (-1 < (char)bVar1) goto LAB_01ecac4e;
  uVar3 = (byte)str[1] ^ 0x80;
  if ((byte)uVar3 < 0x40) {
    if (bVar1 < 0xe0) {
      if ((0xbf < bVar1) && (uVar3 = (bVar1 & 0x1f) << 6 | uVar3, 0x7f < uVar3)) {
        iVar2 = 2;
        goto LAB_01ecac4e;
      }
    }
    else {
      uVar4 = (byte)str[2] ^ 0x80;
      if ((byte)uVar4 < 0x40) {
        if (bVar1 < 0xf0) {
          uVar3 = (bVar1 & 0xf) << 0xc | uVar3 << 6;
          if (0x7ff < uVar3) {
            uVar3 = uVar3 | uVar4;
            iVar2 = 3;
            goto LAB_01ecac4e;
          }
        }
        else if (((bVar1 < 0xf8) && ((byte)((byte)str[3] ^ 0x80) < 0x40)) &&
                (uVar3 = ((bVar1 & 7) << 0xc | uVar4 | uVar3 << 6) << 6, 0xffff < uVar3)) {
          uVar3 = uVar3 | (byte)str[3] ^ 0x80;
          iVar2 = 4;
          goto LAB_01ecac4e;
        }
      }
    }
  }
  uVar3 = 0xfffd;
LAB_01ecac4e:
  *rune = uVar3;
  return iVar2;
}

Assistant:

int
chartorune(Rune *rune, const char *str)
{
	int c, c1, c2, c3;
	Rune l;

	/*
	 * one character sequence
	 *	00000-0007F => T1
	 */
	c = *(unsigned char*)str;
	if(c < Tx) {
		*rune = c;
		return 1;
	}

	/*
	 * two character sequence
	 *	0080-07FF => T2 Tx
	 */
	c1 = *(unsigned char*)(str+1) ^ Tx;
	if(c1 & Testx)
		goto bad;
	if(c < T3) {
		if(c < T2)
			goto bad;
		l = ((c << Bitx) | c1) & Rune2;
		if(l <= Rune1)
			goto bad;
		*rune = l;
		return 2;
	}

	/*
	 * three character sequence
	 *	0800-FFFF => T3 Tx Tx
	 */
	c2 = *(unsigned char*)(str+2) ^ Tx;
	if(c2 & Testx)
		goto bad;
	if(c < T4) {
		l = ((((c << Bitx) | c1) << Bitx) | c2) & Rune3;
		if(l <= Rune2)
			goto bad;
		*rune = l;
		return 3;
	}

	/*
	 * four character sequence (21-bit value)
	 *	10000-1FFFFF => T4 Tx Tx Tx
	 */
	c3 = *(unsigned char*)(str+3) ^ Tx;
	if (c3 & Testx)
		goto bad;
	if (c < T5) {
		l = ((((((c << Bitx) | c1) << Bitx) | c2) << Bitx) | c3) & Rune4;
		if (l <= Rune3)
			goto bad;
		*rune = l;
		return 4;
	}

	/*
	 * Support for 5-byte or longer UTF-8 would go here, but
	 * since we don't have that, we'll just fall through to bad.
	 */

	/*
	 * bad decoding
	 */
bad:
	*rune = Bad;
	return 1;
}